

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::ApplyTransform
          (PretransformVertices *this,aiMesh *mesh,aiMatrix4x4 *mat)

{
  aiVector3D *paVar1;
  bool bVar2;
  uint uVar3;
  aiMatrix4x4t<float> *this_00;
  aiVector3t<float> *paVar4;
  uint i;
  ulong uVar5;
  uint i_1;
  long lVar6;
  aiVector3t<float> aVar7;
  aiMatrix4x4 mWorldIT;
  aiVector3t<float> local_a8;
  aiMatrix3x3t<float> local_98;
  aiMatrix4x4t<float> local_68;
  
  bVar2 = aiMatrix4x4t<float>::IsIdentity(mat);
  if (!bVar2) {
    uVar3 = mesh->mNumVertices;
    if (uVar3 != 0 && mesh->mVertices != (aiVector3D *)0x0) {
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
        aVar7 = ::operator*(mat,(aiVector3t<float> *)((long)&mesh->mVertices->x + lVar6));
        paVar1 = mesh->mVertices;
        *(long *)((long)&paVar1->x + lVar6) = aVar7._0_8_;
        *(float *)((long)&paVar1->z + lVar6) = aVar7.z;
        uVar3 = mesh->mNumVertices;
        lVar6 = lVar6 + 0xc;
      }
    }
    if ((mesh->mNormals == (aiVector3D *)0x0 || uVar3 == 0) &&
       (bVar2 = aiMesh::HasTangentsAndBitangents(mesh), !bVar2)) {
      return;
    }
    local_68.a1 = mat->a1;
    local_68.a2 = mat->a2;
    local_68.a3 = mat->a3;
    local_68.a4 = mat->a4;
    local_68.b1 = mat->b1;
    local_68.b2 = mat->b2;
    local_68.b3 = mat->b3;
    local_68.b4 = mat->b4;
    local_68.c1 = mat->c1;
    local_68.c2 = mat->c2;
    local_68.c3 = mat->c3;
    local_68.c4 = mat->c4;
    local_68.d1 = mat->d1;
    local_68.d2 = mat->d2;
    local_68.d3 = mat->d3;
    local_68.d4 = mat->d4;
    this_00 = aiMatrix4x4t<float>::Inverse(&local_68);
    aiMatrix4x4t<float>::Transpose(this_00);
    local_98.a1 = local_68.a1;
    local_98.c1 = local_68.c1;
    local_98.c2 = local_68.c2;
    local_98.a2 = local_68.a2;
    local_98.a3 = local_68.a3;
    local_98.b1 = local_68.b1;
    local_98.b2 = local_68.b2;
    local_98.b3 = local_68.b3;
    local_98.c3 = local_68.c3;
    uVar3 = mesh->mNumVertices;
    if (uVar3 != 0 && mesh->mNormals != (aiVector3D *)0x0) {
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
        aVar7 = ::operator*(&local_98,(aiVector3t<float> *)((long)&mesh->mNormals->x + lVar6));
        local_a8.z = aVar7.z;
        local_a8._0_8_ = aVar7._0_8_;
        paVar4 = aiVector3t<float>::Normalize(&local_a8);
        paVar1 = mesh->mNormals;
        *(undefined8 *)((long)&paVar1->x + lVar6) = *(undefined8 *)paVar4;
        *(float *)((long)&paVar1->z + lVar6) = paVar4->z;
        uVar3 = mesh->mNumVertices;
        lVar6 = lVar6 + 0xc;
      }
    }
    bVar2 = aiMesh::HasTangentsAndBitangents(mesh);
    if (bVar2) {
      lVar6 = 0;
      for (uVar5 = 0; uVar5 < mesh->mNumVertices; uVar5 = uVar5 + 1) {
        aVar7 = ::operator*(&local_98,(aiVector3t<float> *)((long)&mesh->mTangents->x + lVar6));
        local_a8.z = aVar7.z;
        local_a8._0_8_ = aVar7._0_8_;
        paVar4 = aiVector3t<float>::Normalize(&local_a8);
        paVar1 = mesh->mTangents;
        *(undefined8 *)((long)&paVar1->x + lVar6) = *(undefined8 *)paVar4;
        *(float *)((long)&paVar1->z + lVar6) = paVar4->z;
        aVar7 = ::operator*(&local_98,(aiVector3t<float> *)((long)&mesh->mBitangents->x + lVar6));
        local_a8.z = aVar7.z;
        local_a8._0_8_ = aVar7._0_8_;
        paVar4 = aiVector3t<float>::Normalize(&local_a8);
        paVar1 = mesh->mBitangents;
        *(undefined8 *)((long)&paVar1->x + lVar6) = *(undefined8 *)paVar4;
        *(float *)((long)&paVar1->z + lVar6) = paVar4->z;
        lVar6 = lVar6 + 0xc;
      }
    }
  }
  return;
}

Assistant:

void PretransformVertices::ApplyTransform(aiMesh* mesh, const aiMatrix4x4& mat)
{
    // Check whether we need to transform the coordinates at all
    if (!mat.IsIdentity()) {

        if (mesh->HasPositions()) {
            for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                mesh->mVertices[i] = mat * mesh->mVertices[i];
            }
        }
        if (mesh->HasNormals() || mesh->HasTangentsAndBitangents()) {
            aiMatrix4x4 mWorldIT = mat;
            mWorldIT.Inverse().Transpose();

            // TODO: implement Inverse() for aiMatrix3x3
            aiMatrix3x3 m = aiMatrix3x3(mWorldIT);

            if (mesh->HasNormals()) {
                for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                    mesh->mNormals[i] = (m * mesh->mNormals[i]).Normalize();
                }
            }
            if (mesh->HasTangentsAndBitangents()) {
                for (unsigned int i = 0; i < mesh->mNumVertices; ++i) {
                    mesh->mTangents[i]   = (m * mesh->mTangents[i]).Normalize();
                    mesh->mBitangents[i] = (m * mesh->mBitangents[i]).Normalize();
                }
            }
        }
    }
}